

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gentl_wrapper_linux.cc
# Opt level: O1

void __thiscall rcg::GenTLWrapper::GenTLWrapper(GenTLWrapper *this,string *filename)

{
  void *pvVar1;
  PGCInitLib p_Var2;
  PGCCloseLib p_Var3;
  PGCGetInfo p_Var4;
  PGCGetLastError p_Var5;
  PGCReadPort p_Var6;
  PGCWritePort p_Var7;
  PGCGetPortURL p_Var8;
  PGCGetPortInfo p_Var9;
  PGCRegisterEvent p_Var10;
  PGCUnregisterEvent p_Var11;
  PEventGetData p_Var12;
  PEventGetDataInfo p_Var13;
  PEventGetInfo p_Var14;
  PEventFlush p_Var15;
  PEventKill p_Var16;
  PTLOpen p_Var17;
  PTLClose p_Var18;
  PTLGetInfo p_Var19;
  PTLGetNumInterfaces p_Var20;
  PTLGetInterfaceID p_Var21;
  PTLGetInterfaceInfo p_Var22;
  PTLOpenInterface p_Var23;
  PTLUpdateInterfaceList p_Var24;
  PIFClose p_Var25;
  PIFGetInfo p_Var26;
  PIFGetNumDevices p_Var27;
  PIFGetDeviceID p_Var28;
  PIFUpdateDeviceList p_Var29;
  PIFGetDeviceInfo p_Var30;
  PIFOpenDevice p_Var31;
  PDevGetPort p_Var32;
  PDevGetNumDataStreams p_Var33;
  PDevGetDataStreamID p_Var34;
  PDevOpenDataStream p_Var35;
  PDevGetInfo p_Var36;
  PDevClose p_Var37;
  PDSAnnounceBuffer p_Var38;
  PDSAllocAndAnnounceBuffer p_Var39;
  PDSFlushQueue p_Var40;
  PDSStartAcquisition p_Var41;
  PDSStopAcquisition p_Var42;
  PDSGetInfo p_Var43;
  PDSGetBufferID p_Var44;
  PDSClose p_Var45;
  PDSRevokeBuffer p_Var46;
  PDSQueueBuffer p_Var47;
  PDSGetBufferInfo p_Var48;
  PGCGetNumPortURLs p_Var49;
  PGCGetPortURLInfo p_Var50;
  PGCReadPortStacked p_Var51;
  PGCWritePortStacked p_Var52;
  PDSGetBufferChunkData p_Var53;
  PIFGetParentTL p_Var54;
  PDevGetParentIF p_Var55;
  PDSGetParentDev p_Var56;
  PDSGetNumBufferParts p_Var57;
  PDSGetBufferPartInfo p_Var58;
  char *__s;
  long *plVar59;
  size_t sVar60;
  invalid_argument *piVar61;
  size_type *psVar62;
  string tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pvVar1 = (void *)dlopen((filename->_M_dataplus)._M_p,10);
  this->lib = pvVar1;
  if (pvVar1 == (void *)0x0) {
    piVar61 = (invalid_argument *)__cxa_allocate_exception(0x10);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Cannot open GenTL library: ","");
    dlerror();
    plVar59 = (long *)std::__cxx11::string::append((char *)&local_68);
    local_88._M_dataplus._M_p = (pointer)*plVar59;
    psVar62 = (size_type *)(plVar59 + 2);
    if ((size_type *)local_88._M_dataplus._M_p == psVar62) {
      local_88.field_2._M_allocated_capacity = *psVar62;
      local_88.field_2._8_8_ = plVar59[3];
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    }
    else {
      local_88.field_2._M_allocated_capacity = *psVar62;
    }
    local_88._M_string_length = plVar59[1];
    *plVar59 = (long)psVar62;
    plVar59[1] = 0;
    *(undefined1 *)(plVar59 + 2) = 0;
    std::invalid_argument::invalid_argument(piVar61,(string *)&local_88);
    __cxa_throw(piVar61,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  dlerror();
  p_Var2 = (PGCInitLib)dlsym(this->lib,"GCInitLib");
  this->GCInitLib = p_Var2;
  p_Var3 = (PGCCloseLib)dlsym(this->lib,"GCCloseLib");
  this->GCCloseLib = p_Var3;
  p_Var4 = (PGCGetInfo)dlsym(this->lib,"GCGetInfo");
  this->GCGetInfo = p_Var4;
  p_Var5 = (PGCGetLastError)dlsym(this->lib,"GCGetLastError");
  this->GCGetLastError = p_Var5;
  p_Var6 = (PGCReadPort)dlsym(this->lib,"GCReadPort");
  this->GCReadPort = p_Var6;
  p_Var7 = (PGCWritePort)dlsym(this->lib,"GCWritePort");
  this->GCWritePort = p_Var7;
  p_Var8 = (PGCGetPortURL)dlsym(this->lib,"GCGetPortURL");
  this->GCGetPortURL = p_Var8;
  p_Var9 = (PGCGetPortInfo)dlsym(this->lib,"GCGetPortInfo");
  this->GCGetPortInfo = p_Var9;
  p_Var10 = (PGCRegisterEvent)dlsym(this->lib,"GCRegisterEvent");
  this->GCRegisterEvent = p_Var10;
  p_Var11 = (PGCUnregisterEvent)dlsym(this->lib,"GCUnregisterEvent");
  this->GCUnregisterEvent = p_Var11;
  p_Var12 = (PEventGetData)dlsym(this->lib,"EventGetData");
  this->EventGetData = p_Var12;
  p_Var13 = (PEventGetDataInfo)dlsym(this->lib,"EventGetDataInfo");
  this->EventGetDataInfo = p_Var13;
  p_Var14 = (PEventGetInfo)dlsym(this->lib,"EventGetInfo");
  this->EventGetInfo = p_Var14;
  p_Var15 = (PEventFlush)dlsym(this->lib,"EventFlush");
  this->EventFlush = p_Var15;
  p_Var16 = (PEventKill)dlsym(this->lib,"EventKill");
  this->EventKill = p_Var16;
  p_Var17 = (PTLOpen)dlsym(this->lib,"TLOpen");
  this->TLOpen = p_Var17;
  p_Var18 = (PTLClose)dlsym(this->lib,"TLClose");
  this->TLClose = p_Var18;
  p_Var19 = (PTLGetInfo)dlsym(this->lib,"TLGetInfo");
  this->TLGetInfo = p_Var19;
  p_Var20 = (PTLGetNumInterfaces)dlsym(this->lib,"TLGetNumInterfaces");
  this->TLGetNumInterfaces = p_Var20;
  p_Var21 = (PTLGetInterfaceID)dlsym(this->lib,"TLGetInterfaceID");
  this->TLGetInterfaceID = p_Var21;
  p_Var22 = (PTLGetInterfaceInfo)dlsym(this->lib,"TLGetInterfaceInfo");
  this->TLGetInterfaceInfo = p_Var22;
  p_Var23 = (PTLOpenInterface)dlsym(this->lib,"TLOpenInterface");
  this->TLOpenInterface = p_Var23;
  p_Var24 = (PTLUpdateInterfaceList)dlsym(this->lib,"TLUpdateInterfaceList");
  this->TLUpdateInterfaceList = p_Var24;
  p_Var25 = (PIFClose)dlsym(this->lib,"IFClose");
  this->IFClose = p_Var25;
  p_Var26 = (PIFGetInfo)dlsym(this->lib,"IFGetInfo");
  this->IFGetInfo = p_Var26;
  p_Var27 = (PIFGetNumDevices)dlsym(this->lib,"IFGetNumDevices");
  this->IFGetNumDevices = p_Var27;
  p_Var28 = (PIFGetDeviceID)dlsym(this->lib,"IFGetDeviceID");
  this->IFGetDeviceID = p_Var28;
  p_Var29 = (PIFUpdateDeviceList)dlsym(this->lib,"IFUpdateDeviceList");
  this->IFUpdateDeviceList = p_Var29;
  p_Var30 = (PIFGetDeviceInfo)dlsym(this->lib,"IFGetDeviceInfo");
  this->IFGetDeviceInfo = p_Var30;
  p_Var31 = (PIFOpenDevice)dlsym(this->lib,"IFOpenDevice");
  this->IFOpenDevice = p_Var31;
  p_Var32 = (PDevGetPort)dlsym(this->lib,"DevGetPort");
  this->DevGetPort = p_Var32;
  p_Var33 = (PDevGetNumDataStreams)dlsym(this->lib,"DevGetNumDataStreams");
  this->DevGetNumDataStreams = p_Var33;
  p_Var34 = (PDevGetDataStreamID)dlsym(this->lib,"DevGetDataStreamID");
  this->DevGetDataStreamID = p_Var34;
  p_Var35 = (PDevOpenDataStream)dlsym(this->lib,"DevOpenDataStream");
  this->DevOpenDataStream = p_Var35;
  p_Var36 = (PDevGetInfo)dlsym(this->lib,"DevGetInfo");
  this->DevGetInfo = p_Var36;
  p_Var37 = (PDevClose)dlsym(this->lib,"DevClose");
  this->DevClose = p_Var37;
  p_Var38 = (PDSAnnounceBuffer)dlsym(this->lib,"DSAnnounceBuffer");
  this->DSAnnounceBuffer = p_Var38;
  p_Var39 = (PDSAllocAndAnnounceBuffer)dlsym(this->lib,"DSAllocAndAnnounceBuffer");
  this->DSAllocAndAnnounceBuffer = p_Var39;
  p_Var40 = (PDSFlushQueue)dlsym(this->lib,"DSFlushQueue");
  this->DSFlushQueue = p_Var40;
  p_Var41 = (PDSStartAcquisition)dlsym(this->lib,"DSStartAcquisition");
  this->DSStartAcquisition = p_Var41;
  p_Var42 = (PDSStopAcquisition)dlsym(this->lib,"DSStopAcquisition");
  this->DSStopAcquisition = p_Var42;
  p_Var43 = (PDSGetInfo)dlsym(this->lib,"DSGetInfo");
  this->DSGetInfo = p_Var43;
  p_Var44 = (PDSGetBufferID)dlsym(this->lib,"DSGetBufferID");
  this->DSGetBufferID = p_Var44;
  p_Var45 = (PDSClose)dlsym(this->lib,"DSClose");
  this->DSClose = p_Var45;
  p_Var46 = (PDSRevokeBuffer)dlsym(this->lib,"DSRevokeBuffer");
  this->DSRevokeBuffer = p_Var46;
  p_Var47 = (PDSQueueBuffer)dlsym(this->lib,"DSQueueBuffer");
  this->DSQueueBuffer = p_Var47;
  p_Var48 = (PDSGetBufferInfo)dlsym(this->lib,"DSGetBufferInfo");
  this->DSGetBufferInfo = p_Var48;
  p_Var49 = (PGCGetNumPortURLs)dlsym(this->lib,"GCGetNumPortURLs");
  this->GCGetNumPortURLs = p_Var49;
  p_Var50 = (PGCGetPortURLInfo)dlsym(this->lib,"GCGetPortURLInfo");
  this->GCGetPortURLInfo = p_Var50;
  p_Var51 = (PGCReadPortStacked)dlsym(this->lib,"GCReadPortStacked");
  this->GCReadPortStacked = p_Var51;
  p_Var52 = (PGCWritePortStacked)dlsym(this->lib,"GCWritePortStacked");
  this->GCWritePortStacked = p_Var52;
  p_Var53 = (PDSGetBufferChunkData)dlsym(this->lib,"DSGetBufferChunkData");
  this->DSGetBufferChunkData = p_Var53;
  p_Var54 = (PIFGetParentTL)dlsym(this->lib,"IFGetParentTL");
  this->IFGetParentTL = p_Var54;
  p_Var55 = (PDevGetParentIF)dlsym(this->lib,"DevGetParentIF");
  this->DevGetParentIF = p_Var55;
  p_Var56 = (PDSGetParentDev)dlsym(this->lib,"DSGetParentDev");
  this->DSGetParentDev = p_Var56;
  p_Var57 = (PDSGetNumBufferParts)dlsym(this->lib,"DSGetNumBufferParts");
  this->DSGetNumBufferParts = p_Var57;
  p_Var58 = (PDSGetBufferPartInfo)dlsym(this->lib,"DSGetBufferPartInfo");
  this->DSGetBufferPartInfo = p_Var58;
  __s = (char *)dlerror();
  if (__s == (char *)0x0) {
    return;
  }
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  sVar60 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,__s,__s + sVar60);
  dlclose(this->lib);
  piVar61 = (invalid_argument *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Cannot resolve GenTL symbol: ","");
  std::operator+(&local_68,&local_48,&local_88);
  std::invalid_argument::invalid_argument(piVar61,(string *)&local_68);
  __cxa_throw(piVar61,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

GenTLWrapper::GenTLWrapper(const std::string &filename)
{
  // open library

  // NOTE: RTLD_DEEPBIND is necessary for resolving symbols of the loaded
  // library locally before using global symbols. This is for example needed
  // if rc_genicam_api is used in a ROS node or nodelet and a transport layer
  // library internally uses boost in a different version as in ROS.

  lib=dlopen(filename.c_str(), RTLD_NOW | RTLD_DEEPBIND);

  if (lib == 0)
  {
    throw std::invalid_argument(std::string("Cannot open GenTL library: ")+dlerror());
  }

  dlerror(); // clear possible existing error

  // resolve function calls that will only be used privately

  *reinterpret_cast<void**>(&GCInitLib)=dlsym(lib, "GCInitLib");
  *reinterpret_cast<void**>(&GCCloseLib)=dlsym(lib, "GCCloseLib");

  // resolve public symbols

  *reinterpret_cast<void**>(&GCGetInfo)=dlsym(lib, "GCGetInfo");
  *reinterpret_cast<void**>(&GCGetLastError)=dlsym(lib, "GCGetLastError");
  *reinterpret_cast<void**>(&GCReadPort)=dlsym(lib, "GCReadPort");
  *reinterpret_cast<void**>(&GCWritePort)=dlsym(lib, "GCWritePort");
  *reinterpret_cast<void**>(&GCGetPortURL)=dlsym(lib, "GCGetPortURL");
  *reinterpret_cast<void**>(&GCGetPortInfo)=dlsym(lib, "GCGetPortInfo");

  *reinterpret_cast<void**>(&GCRegisterEvent)=dlsym(lib, "GCRegisterEvent");
  *reinterpret_cast<void**>(&GCUnregisterEvent)=dlsym(lib, "GCUnregisterEvent");
  *reinterpret_cast<void**>(&EventGetData)=dlsym(lib, "EventGetData");
  *reinterpret_cast<void**>(&EventGetDataInfo)=dlsym(lib, "EventGetDataInfo");
  *reinterpret_cast<void**>(&EventGetInfo)=dlsym(lib, "EventGetInfo");
  *reinterpret_cast<void**>(&EventFlush)=dlsym(lib, "EventFlush");
  *reinterpret_cast<void**>(&EventKill)=dlsym(lib, "EventKill");
  *reinterpret_cast<void**>(&TLOpen)=dlsym(lib, "TLOpen");
  *reinterpret_cast<void**>(&TLClose)=dlsym(lib, "TLClose");
  *reinterpret_cast<void**>(&TLGetInfo)=dlsym(lib, "TLGetInfo");
  *reinterpret_cast<void**>(&TLGetNumInterfaces)=dlsym(lib, "TLGetNumInterfaces");
  *reinterpret_cast<void**>(&TLGetInterfaceID)=dlsym(lib, "TLGetInterfaceID");
  *reinterpret_cast<void**>(&TLGetInterfaceInfo)=dlsym(lib, "TLGetInterfaceInfo");
  *reinterpret_cast<void**>(&TLOpenInterface)=dlsym(lib, "TLOpenInterface");
  *reinterpret_cast<void**>(&TLUpdateInterfaceList)=dlsym(lib, "TLUpdateInterfaceList");
  *reinterpret_cast<void**>(&IFClose)=dlsym(lib, "IFClose");
  *reinterpret_cast<void**>(&IFGetInfo)=dlsym(lib, "IFGetInfo");
  *reinterpret_cast<void**>(&IFGetNumDevices)=dlsym(lib, "IFGetNumDevices");
  *reinterpret_cast<void**>(&IFGetDeviceID)=dlsym(lib, "IFGetDeviceID");
  *reinterpret_cast<void**>(&IFUpdateDeviceList)=dlsym(lib, "IFUpdateDeviceList");
  *reinterpret_cast<void**>(&IFGetDeviceInfo)=dlsym(lib, "IFGetDeviceInfo");
  *reinterpret_cast<void**>(&IFOpenDevice)=dlsym(lib, "IFOpenDevice");

  *reinterpret_cast<void**>(&DevGetPort)=dlsym(lib, "DevGetPort");
  *reinterpret_cast<void**>(&DevGetNumDataStreams)=dlsym(lib, "DevGetNumDataStreams");
  *reinterpret_cast<void**>(&DevGetDataStreamID)=dlsym(lib, "DevGetDataStreamID");
  *reinterpret_cast<void**>(&DevOpenDataStream)=dlsym(lib, "DevOpenDataStream");
  *reinterpret_cast<void**>(&DevGetInfo)=dlsym(lib, "DevGetInfo");
  *reinterpret_cast<void**>(&DevClose)=dlsym(lib, "DevClose");

  *reinterpret_cast<void**>(&DSAnnounceBuffer)=dlsym(lib, "DSAnnounceBuffer");
  *reinterpret_cast<void**>(&DSAllocAndAnnounceBuffer)=dlsym(lib, "DSAllocAndAnnounceBuffer");
  *reinterpret_cast<void**>(&DSFlushQueue)=dlsym(lib, "DSFlushQueue");
  *reinterpret_cast<void**>(&DSStartAcquisition)=dlsym(lib, "DSStartAcquisition");
  *reinterpret_cast<void**>(&DSStopAcquisition)=dlsym(lib, "DSStopAcquisition");
  *reinterpret_cast<void**>(&DSGetInfo)=dlsym(lib, "DSGetInfo");
  *reinterpret_cast<void**>(&DSGetBufferID)=dlsym(lib, "DSGetBufferID");
  *reinterpret_cast<void**>(&DSClose)=dlsym(lib, "DSClose");
  *reinterpret_cast<void**>(&DSRevokeBuffer)=dlsym(lib, "DSRevokeBuffer");
  *reinterpret_cast<void**>(&DSQueueBuffer)=dlsym(lib, "DSQueueBuffer");
  *reinterpret_cast<void**>(&DSGetBufferInfo)=dlsym(lib, "DSGetBufferInfo");

  *reinterpret_cast<void**>(&GCGetNumPortURLs)=dlsym(lib, "GCGetNumPortURLs");
  *reinterpret_cast<void**>(&GCGetPortURLInfo)=dlsym(lib, "GCGetPortURLInfo");
  *reinterpret_cast<void**>(&GCReadPortStacked)=dlsym(lib, "GCReadPortStacked");
  *reinterpret_cast<void**>(&GCWritePortStacked)=dlsym(lib, "GCWritePortStacked");

  *reinterpret_cast<void**>(&DSGetBufferChunkData)=dlsym(lib, "DSGetBufferChunkData");

  *reinterpret_cast<void**>(&IFGetParentTL)=dlsym(lib, "IFGetParentTL");
  *reinterpret_cast<void**>(&DevGetParentIF)=dlsym(lib, "DevGetParentIF");
  *reinterpret_cast<void**>(&DSGetParentDev)=dlsym(lib, "DSGetParentDev");

  *reinterpret_cast<void**>(&DSGetNumBufferParts)=dlsym(lib, "DSGetNumBufferParts");
  *reinterpret_cast<void**>(&DSGetBufferPartInfo)=dlsym(lib, "DSGetBufferPartInfo");

  const char *err=dlerror();

  if (err != 0)
  {
    std::string tmp=err;
    dlclose(lib);
    throw std::invalid_argument(std::string("Cannot resolve GenTL symbol: ")+tmp);
  }
}